

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopResize(sqlite3 *db,WhereLoop *p,int n)

{
  uint uVar1;
  WhereTerm **__dest;
  WhereTerm **paNew;
  int n_local;
  WhereLoop *p_local;
  sqlite3 *db_local;
  
  if ((int)(uint)p->nLSlot < n) {
    uVar1 = n + 7U & 0xfffffff8;
    __dest = (WhereTerm **)sqlite3DbMallocRawNN(db,(long)(int)uVar1 << 3);
    if (__dest == (WhereTerm **)0x0) {
      db_local._4_4_ = 7;
    }
    else {
      memcpy(__dest,p->aLTerm,(ulong)p->nLSlot << 3);
      if (p->aLTerm != p->aLTermSpace) {
        sqlite3DbFreeNN(db,p->aLTerm);
      }
      p->aLTerm = __dest;
      p->nLSlot = (u16)uVar1;
      db_local._4_4_ = 0;
    }
  }
  else {
    db_local._4_4_ = 0;
  }
  return db_local._4_4_;
}

Assistant:

static int whereLoopResize(sqlite3 *db, WhereLoop *p, int n){
  WhereTerm **paNew;
  if( p->nLSlot>=n ) return SQLITE_OK;
  n = (n+7)&~7;
  paNew = sqlite3DbMallocRawNN(db, sizeof(p->aLTerm[0])*n);
  if( paNew==0 ) return SQLITE_NOMEM_BKPT;
  memcpy(paNew, p->aLTerm, sizeof(p->aLTerm[0])*p->nLSlot);
  if( p->aLTerm!=p->aLTermSpace ) sqlite3DbFreeNN(db, p->aLTerm);
  p->aLTerm = paNew;
  p->nLSlot = n;
  return SQLITE_OK;
}